

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

uint64_t __thiscall mkvmuxer::Cues::Size(Cues *this)

{
  uint64_t uVar1;
  uint64 uVar2;
  CuePoint *in_RDI;
  int32_t i;
  uint64_t size;
  uint64 in_stack_ffffffffffffffd8;
  int local_14;
  long local_10;
  
  local_10 = 0;
  for (local_14 = 0; local_14 < *(int32_t *)((long)&in_RDI->time_ + 4); local_14 = local_14 + 1) {
    GetCueByIndex((Cues *)in_RDI,local_14);
    uVar1 = CuePoint::Size(in_RDI);
    local_10 = uVar1 + local_10;
  }
  uVar2 = EbmlMasterElementSize((uint64)in_RDI,in_stack_ffffffffffffffd8);
  return uVar2 + local_10;
}

Assistant:

uint64_t Cues::Size() {
  uint64_t size = 0;
  for (int32_t i = 0; i < cue_entries_size_; ++i)
    size += GetCueByIndex(i)->Size();
  size += EbmlMasterElementSize(libwebm::kMkvCues, size);
  return size;
}